

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

iter_type __thiscall
booster::locale::impl_posix::time_put_posix<char>::do_put
          (time_put_posix<char> *this,iter_type out,ios_base *param_2,char param_3,tm *tm,
          char format,char modifier)

{
  streambuf_type *psVar1;
  undefined8 unaff_RBP;
  ulong uVar2;
  undefined7 in_register_00000081;
  uint uVar3;
  bool bVar4;
  iter_type iVar5;
  char_type fmt [4];
  string_type res;
  ftime_traits<char> local_4c;
  char local_4b;
  char local_4a;
  undefined1 local_49;
  ostreambuf_iterator<char,_std::char_traits<char>_> local_48;
  string local_38;
  
  local_48._M_sbuf = out._M_sbuf;
  local_48._M_failed = out._M_failed;
  uVar3 = 0;
  bVar4 = modifier == '\0';
  if (bVar4) {
    modifier = format;
  }
  local_4c = (ftime_traits<char>)0x25;
  if (bVar4) {
    format = '\0';
  }
  local_49 = 0;
  local_4b = modifier;
  local_4a = format;
  ftime_traits<char>::ftime_abi_cxx11_
            (&local_38,&local_4c,(char *)tm,
             (tm *)*(this->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(locale_t)CONCAT71(in_register_00000081,param_3));
  for (; psVar1 = local_48._M_sbuf, uVar3 < local_38._M_string_length; uVar3 = uVar3 + 1) {
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=
              (&local_48,local_38._M_dataplus._M_p[uVar3]);
  }
  uVar2 = CONCAT71((int7)((ulong)unaff_RBP >> 8),local_48._M_failed);
  std::__cxx11::string::~string((string *)&local_38);
  iVar5._8_8_ = uVar2 & 0xffffffff;
  iVar5._M_sbuf = psVar1;
  return iVar5;
}

Assistant:

virtual iter_type do_put(iter_type out,std::ios_base &/*ios*/,CharType /*fill*/,std::tm const *tm,char format,char modifier) const
    {
        char_type fmt[4] = { '%' , modifier != 0 ? modifier : format , modifier == 0 ? '\0' : format };
        string_type res = ftime_traits<char_type>::ftime(fmt,tm,*lc_);
        for(unsigned i=0;i<res.size();i++)
            *out++ = res[i];
        return out;
    }